

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wb_tree.c
# Opt level: O3

uint fixup(wb_tree *tree,wb_node *n)

{
  wb_node *pwVar1;
  wb_node *pwVar2;
  void *pvVar3;
  wb_node *pwVar4;
  wb_node *pwVar5;
  uint uVar6;
  uint32_t uVar7;
  void *key;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  
  pwVar5 = n->llink;
  if (pwVar5 == (wb_node *)0x0) {
    uVar6 = 1000;
  }
  else {
    uVar6 = pwVar5->weight * 1000;
  }
  if (uVar6 < n->weight * 0x125) {
    pwVar5 = n->rlink;
    if (pwVar5 != (wb_node *)0x0) {
      pwVar4 = pwVar5->llink;
      if (pwVar4 != (wb_node *)0x0) {
        if (pwVar5->weight * 0x24a <= pwVar4->weight * 1000) {
          pwVar1 = n->parent;
          pwVar4->parent = pwVar1;
          if (pwVar1 != (wb_node *)0x0) {
            tree = (wb_tree *)&pwVar1->rlink;
            if (pwVar1->llink == n) {
              tree = (wb_tree *)&pwVar1->llink;
            }
          }
          tree->root = pwVar4;
          pwVar1 = pwVar4->llink;
          pwVar4->llink = n;
          n->parent = pwVar4;
          n->rlink = pwVar1;
          if (pwVar1 != (wb_node *)0x0) {
            pwVar1->parent = n;
          }
          pwVar2 = pwVar4->rlink;
          pwVar4->rlink = pwVar5;
          pwVar5->parent = pwVar4;
          pwVar5->llink = pwVar2;
          if (pwVar2 != (wb_node *)0x0) {
            pwVar2->parent = pwVar5;
          }
          uVar7 = 1;
          uVar9 = 1;
          if (n->llink != (wb_node *)0x0) {
            uVar9 = n->llink->weight;
          }
          if (pwVar1 != (wb_node *)0x0) {
            uVar7 = pwVar1->weight;
          }
          n->weight = uVar7 + uVar9;
          uVar8 = 1;
          uVar10 = 1;
          if (pwVar2 != (wb_node *)0x0) {
            uVar10 = pwVar2->weight;
          }
          if (pwVar5->rlink != (wb_node *)0x0) {
            uVar8 = pwVar5->rlink->weight;
          }
          pwVar5->weight = uVar8 + uVar10;
          uVar9 = uVar8 + uVar10 + uVar7 + uVar9;
          goto LAB_001068b2;
        }
LAB_00106769:
        tree_node_rot_left(tree,n);
        uVar7 = 1;
        uVar9 = 1;
        if (n->llink != (wb_node *)0x0) {
          uVar9 = n->llink->weight;
        }
        if (n->rlink != (wb_node *)0x0) {
          uVar7 = n->rlink->weight;
        }
        n->weight = uVar7 + uVar9;
        uVar10 = 1;
        if (pwVar5->rlink != (wb_node *)0x0) {
          uVar10 = pwVar5->rlink->weight;
        }
        pwVar5->weight = uVar10 + uVar7 + uVar9;
        return 1;
      }
      if (1000 < pwVar5->weight * 0x24a) goto LAB_00106769;
      goto LAB_001068d4;
    }
    fixup_cold_4();
LAB_001068ca:
    fixup_cold_2();
  }
  else {
    if (uVar6 <= n->weight * 0x2c3) {
      return 0;
    }
    if (pwVar5 == (wb_node *)0x0) goto LAB_001068ca;
    if (pwVar5->llink == (wb_node *)0x0) {
      uVar9 = 1;
    }
    else {
      uVar9 = pwVar5->llink->weight;
    }
    if (pwVar5->weight * 0x19e < uVar9 * 1000) {
      tree_node_rot_right(tree,n);
      uVar10 = 1;
      uVar7 = 1;
      if (n->llink != (wb_node *)0x0) {
        uVar7 = n->llink->weight;
      }
      if (n->rlink != (wb_node *)0x0) {
        uVar10 = n->rlink->weight;
      }
      n->weight = uVar10 + uVar7;
      pwVar5->weight = uVar10 + uVar7 + uVar9;
      return 1;
    }
    pwVar4 = pwVar5->rlink;
    if (pwVar4 != (wb_node *)0x0) {
      pwVar1 = n->parent;
      pwVar4->parent = pwVar1;
      if (pwVar1 != (wb_node *)0x0) {
        tree = (wb_tree *)&pwVar1->rlink;
        if (pwVar1->llink == n) {
          tree = (wb_tree *)&pwVar1->llink;
        }
      }
      tree->root = pwVar4;
      pwVar1 = pwVar4->llink;
      pwVar4->llink = pwVar5;
      pwVar5->parent = pwVar4;
      pwVar5->rlink = pwVar1;
      if (pwVar1 != (wb_node *)0x0) {
        pwVar1->parent = pwVar5;
      }
      pwVar2 = pwVar4->rlink;
      pwVar4->rlink = n;
      n->parent = pwVar4;
      n->llink = pwVar2;
      uVar7 = 1;
      uVar9 = 1;
      if (pwVar2 != (wb_node *)0x0) {
        pwVar2->parent = n;
        uVar9 = pwVar2->weight;
      }
      if (n->rlink != (wb_node *)0x0) {
        uVar7 = n->rlink->weight;
      }
      n->weight = uVar7 + uVar9;
      uVar8 = 1;
      uVar10 = 1;
      if (pwVar5->llink != (wb_node *)0x0) {
        uVar10 = pwVar5->llink->weight;
      }
      if (pwVar1 != (wb_node *)0x0) {
        uVar8 = pwVar1->weight;
      }
      pwVar5->weight = uVar8 + uVar10;
      uVar9 = uVar8 + uVar10 + uVar7 + uVar9;
LAB_001068b2:
      pwVar4->weight = uVar9;
      return 2;
    }
  }
  fixup_cold_1();
LAB_001068d4:
  fixup_cold_3();
  pwVar5 = (wb_node *)tree_search_node(n,key);
  if (pwVar5 == (wb_node *)0x0) {
    tree->root = (wb_node *)0x0;
    tree->count = 0;
    tree->cmp_func = (dict_compare_func)0x0;
  }
  else {
    pvVar3 = pwVar5->datum;
    tree->root = (wb_node *)pwVar5->key;
    tree->count = (size_t)pvVar3;
    *(undefined1 *)&tree->cmp_func = 1;
    remove_node((wb_tree *)n,pwVar5);
  }
  return (uint)tree;
}

Assistant:

static inline unsigned
fixup(wb_tree* tree, wb_node* n)
{
    unsigned rotations = 0;
    unsigned weight = WEIGHT(n->llink);
    if (weight * 1000U < n->weight * 293U) {
	wb_node* nr = n->rlink;
	ASSERT(nr != NULL);
	wb_node* nrl = nr->llink;
	if (WEIGHT(nrl) * 1000U < nr->weight * 586U) {	/* LL */
	    /* Rotate |n| left. */
	    tree_node_rot_left(tree, n);
	    nr->weight = (n->weight = WEIGHT(n->llink) + WEIGHT(n->rlink)) +
			 WEIGHT(nr->rlink);
	    rotations += 1;
	} else {					/* RL */
	    /* Rotate |nr| right, then |n| left. */
	    ASSERT(nrl != NULL);
	    wb_node* const p = n->parent;
	    nrl->parent = p;
	    *(p ? (p->llink == n ? &p->llink : &p->rlink) : &tree->root) = nrl;

	    wb_node* const a = nrl->llink;
	    nrl->llink = n;
	    n->parent = nrl;
	    if ((n->rlink = a) != NULL)
		a->parent = n;

	    wb_node* const b = nrl->rlink;
	    nrl->rlink = nr;
	    nr->parent = nrl;
	    if ((nr->llink = b) != NULL)
		b->parent = nr;

	    nrl->weight = (n->weight = WEIGHT(n->llink) + WEIGHT(a)) +
			  (nr->weight = WEIGHT(b) + WEIGHT(nr->rlink));
	    rotations += 2;
	}
    } else if (weight * 1000U > n->weight * 707U) {
	wb_node* nl = n->llink;
	ASSERT(nl != NULL);
	weight = WEIGHT(nl->llink);
	if (weight * 1000U > nl->weight * 414U) {	/* RR */
	    tree_node_rot_right(tree, n);

	    n->weight = WEIGHT(n->llink) + WEIGHT(n->rlink);
	    nl->weight = weight + n->weight;
	    rotations += 1;
	} else {					/* LR */
	    /* Rotate |nl| left, then |n| right. */
	    wb_node* nlr = nl->rlink;
	    ASSERT(nlr != NULL);
	    wb_node* const p = n->parent;
	    nlr->parent = p;
	    *(p ? (p->llink == n ? &p->llink : &p->rlink) : &tree->root) = nlr;

	    wb_node* const a = nlr->llink;
	    nlr->llink = nl;
	    nl->parent = nlr;
	    if ((nl->rlink = a) != NULL)
		a->parent = nl;

	    wb_node* const b = nlr->rlink;
	    nlr->rlink = n;
	    n->parent = nlr;
	    if ((n->llink = b) != NULL)
		b->parent = n;

	    nlr->weight = (n->weight = WEIGHT(b) + WEIGHT(n->rlink)) +
			  (nl->weight = WEIGHT(nl->llink) + WEIGHT(a));
	    rotations += 2;
	}
    }
    return rotations;
}